

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O2

bool helics::zeromq::bindzmqSocket
               (socket_t *socket,string *address,int port,milliseconds timeout,milliseconds period)

{
  socklen_t __len;
  sockaddr *__addr;
  bool bVar1;
  string local_50;
  
  __len = (socklen_t)timeout.__r;
  bVar1 = false;
  while (!bVar1) {
    gmlc::networking::makePortAddress(&local_50,address,port);
    zmq::detail::socket_base::bind
              (&socket->super_socket_base,(int)local_50._M_dataplus._M_p,__addr,__len);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool bindzmqSocket(zmq::socket_t& socket,
                   const std::string& address,
                   int port,
                   milliseconds timeout,
                   milliseconds period)
{
    bool bindsuccess = false;
    milliseconds tcount{0};
    while (!bindsuccess) {
        try {
            socket.bind(gmlc::networking::makePortAddress(address, port));
            bindsuccess = true;
        }
        catch ([[maybe_unused]] const zmq::error_t& ze) {
            if (tcount == milliseconds{0}) {
                // std::cerr << "zmq binding error on socket sleeping then will try again \n";
            }
            if (tcount > timeout) {
                break;
            }
            std::this_thread::sleep_for(period);
            tcount += period;
        }
    }
    return bindsuccess;
}